

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O0

void __thiscall DetailButton::DetailButton(DetailButton *this,QWidget *parent)

{
  QPushButton *in_RDI;
  long in_FS_OFFSET;
  undefined1 *puVar1;
  undefined **parent_00;
  undefined **text;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  parent_00 = &PTR_metaObject_00d25d70;
  *(undefined ***)&(in_RDI->super_QAbstractButton).super_QWidget = &PTR_metaObject_00d25d70;
  text = &PTR__DetailButton_00d25f40;
  *(undefined ***)&(in_RDI->super_QAbstractButton).super_QWidget.super_QPaintDevice =
       &PTR__DetailButton_00d25f40;
  puVar1 = local_20;
  label((DetailButton *)&PTR__DetailButton_00d25f40,ShowLabel);
  QPushButton::QPushButton(in_RDI,(QString *)text,(QWidget *)parent_00);
  QString::~QString((QString *)0x7ab429);
  *(undefined ***)&(in_RDI->super_QAbstractButton).super_QWidget = parent_00;
  *(undefined ***)&(in_RDI->super_QAbstractButton).super_QWidget.super_QPaintDevice = text;
  QWidget::setSizePolicy((QWidget *)parent_00,(Policy)((ulong)puVar1 >> 0x20),(Policy)puVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

DetailButton(QWidget *parent) : QPushButton(label(ShowLabel), parent)
    {
        setSizePolicy(QSizePolicy::Fixed, QSizePolicy::Fixed);
    }